

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatFile.cpp
# Opt level: O0

void __thiscall
DatUnpacker::DatFile::setItems
          (DatFile *this,
          vector<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_> *value)

{
  vector<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_> *pvVar1;
  pointer ppDVar2;
  vector<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_> *this_00;
  vector<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_> *value_local;
  DatFile *this_local;
  
  pvVar1 = this->_items;
  if (pvVar1 != (vector<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_> *)
                0x0) {
    ppDVar2 = pvVar1[-1].
              super__Vector_base<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    this_00 = pvVar1 + (long)ppDVar2;
    while (pvVar1 != this_00) {
      this_00 = this_00 + -1;
      std::vector<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_>::~vector
                (this_00);
    }
    operator_delete__(&pvVar1[-1].
                       super__Vector_base<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)ppDVar2 * 0x18 + 8);
  }
  this->_items = value;
  return;
}

Assistant:

void DatFile::setItems(std::vector<DatFileItem*>* value)
    {
        delete [] _items;
        _items = value;
    }